

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  size_t length;
  size_t iv_len;
  size_t add_len;
  int iVar1;
  int iVar2;
  int iVar3;
  uchar (*add) [64];
  uchar (*input_00) [64];
  uchar (*iv) [64];
  uint keybits;
  ulong uVar4;
  long lVar5;
  uchar (*key) [32];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int local_2a0;
  ulong local_298;
  uchar (*local_280) [16];
  uchar tag_buf [16];
  uchar (*local_238) [64];
  uchar (*local_230) [16];
  long local_228;
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  local_230 = tag_test_data;
  local_238 = ct_test_data;
  iVar1 = 1;
  lVar5 = 0;
  do {
    if (lVar5 == 3) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    uVar4 = lVar5 * 0x40 + 0x80;
    local_280 = local_230;
    local_228 = 0;
    local_298 = 0;
    input_00 = local_238;
    for (lVar6 = -0x18; lVar6 != 0; lVar6 = lVar6 + 4) {
      memset(&ctx,0,0x1a8);
      keybits = (uint)uVar4;
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",uVar4 & 0xffffffff,local_298,"enc");
      }
      key = key_test_data + *(int *)(&UNK_00110ce8 + lVar6);
      local_2a0 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (local_2a0 == -0x72 && uVar4 == 0xc0) {
        puts("skipped");
        break;
      }
      if (local_2a0 != 0) {
LAB_00107c89:
        if (verbose != 0) {
          puts("failed");
        }
        mbedtls_gcm_free(&ctx);
        return local_2a0;
      }
      length = *(size_t *)((long)pt_len_test_data + local_228);
      iv = iv_test_data + *(int *)(&UNK_00110ac8 + lVar6);
      iv_len = *(size_t *)((long)iv_len_test_data + local_228);
      add = additional_test_data + *(int *)(&UNK_00110b18 + lVar6);
      add_len = *(size_t *)((long)add_len_test_data + local_228);
      iVar3 = *(int *)(&UNK_00110ce8 + lVar6);
      input = pt_test_data + iVar3;
      local_2a0 = mbedtls_gcm_crypt_and_tag
                            (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (((local_2a0 != 0) || (iVar2 = bcmp(buf,input_00,length), local_2a0 = iVar1, iVar2 != 0))
         || (auVar7[0] = -((*local_280)[0] == tag_buf[0]),
            auVar7[1] = -((*local_280)[1] == tag_buf[1]),
            auVar7[2] = -((*local_280)[2] == tag_buf[2]),
            auVar7[3] = -((*local_280)[3] == tag_buf[3]),
            auVar7[4] = -((*local_280)[4] == tag_buf[4]),
            auVar7[5] = -((*local_280)[5] == tag_buf[5]),
            auVar7[6] = -((*local_280)[6] == tag_buf[6]),
            auVar7[7] = -((*local_280)[7] == tag_buf[7]),
            auVar7[8] = -((*local_280)[8] == tag_buf[8]),
            auVar7[9] = -((*local_280)[9] == tag_buf[9]),
            auVar7[10] = -((*local_280)[10] == tag_buf[10]),
            auVar7[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
            auVar7[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
            auVar7[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
            auVar7[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
            auVar7[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
            (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_00107c89;
      mbedtls_gcm_free(&ctx);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d (%s): ",uVar4 & 0xffffffff,local_298,"dec");
      }
      local_2a0 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (local_2a0 != 0) goto LAB_00107c89;
      local_2a0 = mbedtls_gcm_crypt_and_tag
                            (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (((local_2a0 != 0) || (iVar2 = bcmp(buf,input,length), local_2a0 = iVar1, iVar2 != 0)) ||
         (auVar8[0] = -((*local_280)[0] == tag_buf[0]), auVar8[1] = -((*local_280)[1] == tag_buf[1])
         , auVar8[2] = -((*local_280)[2] == tag_buf[2]),
         auVar8[3] = -((*local_280)[3] == tag_buf[3]), auVar8[4] = -((*local_280)[4] == tag_buf[4]),
         auVar8[5] = -((*local_280)[5] == tag_buf[5]), auVar8[6] = -((*local_280)[6] == tag_buf[6]),
         auVar8[7] = -((*local_280)[7] == tag_buf[7]), auVar8[8] = -((*local_280)[8] == tag_buf[8]),
         auVar8[9] = -((*local_280)[9] == tag_buf[9]),
         auVar8[10] = -((*local_280)[10] == tag_buf[10]),
         auVar8[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar8[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar8[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar8[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar8[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
         != 0xffff)) goto LAB_00107c89;
      mbedtls_gcm_free(&ctx);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar4 & 0xffffffff,local_298,"enc");
      }
      local_2a0 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((local_2a0 != 0) ||
         (local_2a0 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len), local_2a0 != 0))
      goto LAB_00107c89;
      if (local_298 < 2) {
        local_2a0 = mbedtls_gcm_update(&ctx,length,*input,buf);
      }
      else {
        local_2a0 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (local_2a0 != 0) goto LAB_00107c89;
        local_2a0 = mbedtls_gcm_update(&ctx,length - 0x20,pt_test_data[iVar3] + 0x20,buf + 0x20);
      }
      if (local_2a0 != 0) goto LAB_00107c89;
      local_2a0 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (((local_2a0 != 0) || (iVar3 = bcmp(buf,input_00,length), local_2a0 = iVar1, iVar3 != 0))
         || (auVar9[0] = -((*local_280)[0] == tag_buf[0]),
            auVar9[1] = -((*local_280)[1] == tag_buf[1]),
            auVar9[2] = -((*local_280)[2] == tag_buf[2]),
            auVar9[3] = -((*local_280)[3] == tag_buf[3]),
            auVar9[4] = -((*local_280)[4] == tag_buf[4]),
            auVar9[5] = -((*local_280)[5] == tag_buf[5]),
            auVar9[6] = -((*local_280)[6] == tag_buf[6]),
            auVar9[7] = -((*local_280)[7] == tag_buf[7]),
            auVar9[8] = -((*local_280)[8] == tag_buf[8]),
            auVar9[9] = -((*local_280)[9] == tag_buf[9]),
            auVar9[10] = -((*local_280)[10] == tag_buf[10]),
            auVar9[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
            auVar9[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
            auVar9[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
            auVar9[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
            auVar9[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
            (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar9[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_00107c89;
      mbedtls_gcm_free(&ctx);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar4 & 0xffffffff,local_298,"dec");
      }
      local_2a0 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((local_2a0 != 0) ||
         (local_2a0 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len), local_2a0 != 0))
      goto LAB_00107c89;
      if (local_298 < 2) {
        local_2a0 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
      }
      else {
        local_2a0 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (local_2a0 != 0) goto LAB_00107c89;
        local_2a0 = mbedtls_gcm_update(&ctx,length - 0x20,*input_00 + 0x20,buf + 0x20);
      }
      if (local_2a0 != 0) goto LAB_00107c89;
      local_2a0 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (((local_2a0 != 0) || (iVar3 = bcmp(buf,input,length), local_2a0 = iVar1, iVar3 != 0)) ||
         (auVar10[0] = -((*local_280)[0] == tag_buf[0]),
         auVar10[1] = -((*local_280)[1] == tag_buf[1]),
         auVar10[2] = -((*local_280)[2] == tag_buf[2]),
         auVar10[3] = -((*local_280)[3] == tag_buf[3]),
         auVar10[4] = -((*local_280)[4] == tag_buf[4]),
         auVar10[5] = -((*local_280)[5] == tag_buf[5]),
         auVar10[6] = -((*local_280)[6] == tag_buf[6]),
         auVar10[7] = -((*local_280)[7] == tag_buf[7]),
         auVar10[8] = -((*local_280)[8] == tag_buf[8]),
         auVar10[9] = -((*local_280)[9] == tag_buf[9]),
         auVar10[10] = -((*local_280)[10] == tag_buf[10]),
         auVar10[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar10[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar10[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar10[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar10[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_00107c89;
      mbedtls_gcm_free(&ctx);
      if (verbose != 0) {
        puts("passed");
      }
      local_298 = local_298 + 1;
      local_228 = local_228 + 8;
      local_280 = local_280 + 1;
      input_00 = input_00 + 1;
    }
    lVar5 = lVar5 + 1;
    local_230 = local_230 + 6;
    local_238 = local_238 + 6;
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            /*
             * AES-192 is an optional feature that may be unavailable when
             * there is an alternative underlying implementation i.e. when
             * MBEDTLS_AES_ALT is defined.
             */
            if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && key_len == 192 )
            {
                mbedtls_printf( "skipped\n" );
                break;
            }
            else if( ret != 0 )
            {
                goto exit;
            }

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                pt_test_data[pt_index_test_data[i]],
                                buf, 16, tag_buf );
            if( ret != 0 )
                goto exit;

            if ( memcmp( buf, ct_test_data[j * 6 + i],
                         pt_len_test_data[i] ) != 0 ||
                 memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                ct_test_data[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                                  iv_test_data[iv_index_test_data[i]],
                                  iv_len_test_data[i],
                                  additional_test_data[add_index_test_data[i]],
                                  add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32,
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                      pt_test_data[pt_index_test_data[i]] + 32,
                                      buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, ct_test_data[j * 6 + i],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv_test_data[iv_index_test_data[i]],
                              iv_len_test_data[i],
                              additional_test_data[add_index_test_data[i]],
                              add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                          ct_test_data[j * 6 + i] + 32,
                                          buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    ret = 0;

exit:
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );
        mbedtls_gcm_free( &ctx );
    }

    return( ret );
}